

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall spvtools::opt::CFG::ComputeStructuredSuccessors(CFG *this,Function *func)

{
  BasicBlock *this_00;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  this_01;
  uint32_t uVar1;
  mapped_type *pmVar2;
  vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *pvVar3;
  pointer puVar4;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_78;
  _Map_base<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  BasicBlock *local_48;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  pointer local_38;
  
  local_70 = (_Map_base<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->block2structured_succs_;
  std::
  _Hashtable<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_70);
  puVar4 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != local_38) {
    local_40 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->label2preds_;
    local_48 = &this->pseudo_entry_block_;
    do {
      this_00 = (puVar4->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      this_01._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (this_00->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t;
      uVar1 = 0;
      if (*(char *)((long)this_01._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x2d) == '\x01') {
        uVar1 = Instruction::GetSingleWordOperand
                          ((Instruction *)
                           this_01._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                           (uint)*(byte *)((long)this_01._M_t.
                                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                 .
                                                 super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                 ._M_head_impl + 0x2c));
      }
      local_68._0_4_ = uVar1;
      pmVar2 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_40,(key_type *)local_68._M_pod_data);
      if ((pmVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (pmVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        local_68._M_unused._M_object = local_48;
        pvVar3 = (vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 std::__detail::
                 _Map_base<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_70,(key_type *)&local_68);
        local_78._M_head_impl = this_00;
        std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
        emplace_back<spvtools::opt::BasicBlock*>(pvVar3,&local_78._M_head_impl);
      }
      uVar1 = BasicBlock::MergeBlockIdIfAny(this_00);
      if (uVar1 != 0) {
        local_68._M_unused._0_8_ = (undefined8)this_00;
        pvVar3 = (vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 std::__detail::
                 _Map_base<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_70,(key_type *)&local_68);
        local_78._M_head_impl = block(this,uVar1);
        std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
        emplace_back<spvtools::opt::BasicBlock*>(pvVar3,&local_78._M_head_impl);
        uVar1 = BasicBlock::ContinueBlockIdIfAny(this_00);
        if (uVar1 != 0) {
          local_68._M_unused._0_8_ = (undefined8)this_00;
          pvVar3 = (vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                   std::__detail::
                   _Map_base<const_spvtools::opt::BasicBlock_*,_std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_70,(key_type *)&local_68);
          local_78._M_head_impl = block(this,uVar1);
          std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
          emplace_back<spvtools::opt::BasicBlock*>(pvVar3,&local_78._M_head_impl);
        }
      }
      local_50 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:162:37)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:162:37)>
                 ::_M_manager;
      local_68._M_unused._0_8_ = (undefined8)this_00;
      local_68._8_8_ = this;
      BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int)> *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_38);
  }
  return;
}

Assistant:

void CFG::ComputeStructuredSuccessors(Function* func) {
  block2structured_succs_.clear();
  for (auto& blk : *func) {
    // If no predecessors in function, make successor to pseudo entry.
    if (label2preds_[blk.id()].size() == 0)
      block2structured_succs_[&pseudo_entry_block_].push_back(&blk);

    // If header, make merge block first successor and continue block second
    // successor if there is one.
    uint32_t mbid = blk.MergeBlockIdIfAny();
    if (mbid != 0) {
      block2structured_succs_[&blk].push_back(block(mbid));
      uint32_t cbid = blk.ContinueBlockIdIfAny();
      if (cbid != 0) {
        block2structured_succs_[&blk].push_back(block(cbid));
      }
    }

    // Add true successors.
    const auto& const_blk = blk;
    const_blk.ForEachSuccessorLabel([&blk, this](const uint32_t sbid) {
      block2structured_succs_[&blk].push_back(block(sbid));
    });
  }
}